

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_ARB1_NRM(Context *ctx)

{
  int iVar1;
  char local_d8 [8];
  char buf [64];
  char src0 [64];
  char dst [64];
  Context *ctx_local;
  
  if (ctx->profile_supports_nv4 == 0) {
    if (ctx->profile_supports_nv2 != 0) {
      iVar1 = shader_is_pixel(ctx);
      if (iVar1 != 0) goto LAB_00115f97;
    }
    make_ARB1_destarg_string(ctx,src0 + 0x38,0x40);
    make_ARB1_srcarg_string(ctx,0,buf + 0x38,0x40);
    allocate_ARB1_scratch_reg_name(ctx,local_d8,0x40);
    output_line(ctx,"DP3 %s.w, %s, %s;",local_d8,buf + 0x38,buf + 0x38);
    output_line(ctx,"RSQ %s.w, %s.w;",local_d8,local_d8);
    output_line(ctx,"MUL%s, %s.w, %s;",src0 + 0x38,local_d8,buf + 0x38);
    emit_ARB1_dest_modifiers(ctx);
  }
  else {
LAB_00115f97:
    emit_ARB1_opcode_ds(ctx,"NRM");
  }
  return;
}

Assistant:

EMIT_ARB1_OPCODE_DS_FUNC(ABS)

static void emit_ARB1_NRM(Context *ctx)
{
    // nv2 fragment programs (and anything nv4) have a real NRM.
    if ( (support_nv4(ctx)) || ((support_nv2(ctx)) && (shader_is_pixel(ctx))) )
        emit_ARB1_opcode_ds(ctx, "NRM");
    else
    {
        char dst[64]; make_ARB1_destarg_string(ctx, dst, sizeof (dst));
        char src0[64]; make_ARB1_srcarg_string(ctx, 0, src0, sizeof (src0));
        char buf[64]; allocate_ARB1_scratch_reg_name(ctx, buf, sizeof (buf));
        output_line(ctx, "DP3 %s.w, %s, %s;", buf, src0, src0);
        output_line(ctx, "RSQ %s.w, %s.w;", buf, buf);
        output_line(ctx, "MUL%s, %s.w, %s;", dst, buf, src0);
        emit_ARB1_dest_modifiers(ctx);
    } // else
}